

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O3

Var Js::JavascriptReflect::EntryGet(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  Var receiver;
  RecyclableObject *instance;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  undefined1 local_40 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x55,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d00781;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_40 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_40,(CallInfo *)&__tag.entry.next);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  callInfo_local =
       (CallInfo)
       (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)__tag.entry.next,
             L"Reflect.get",&stack0x00000000);
  uVar4 = local_40._0_4_;
  if (((ulong)local_40 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x5a,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00d00781:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar4 = local_40._0_4_;
  }
  if ((uVar4 >> 0x18 & 1) == 0) {
    hCode = -0x7ff5ec36;
    if ((uVar4 & 0xfffffe) != 0) {
      pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
      BVar5 = JavascriptOperators::IsObject(pvVar7);
      if (BVar5 != 0) {
        pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
        if (2 < (local_40._0_4_ & 0xffffff)) {
          callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)local_40,2);
        }
        receiver = pvVar7;
        if (((ulong)local_40 & 0xfffffc) != 0) {
          receiver = Arguments::operator[]((Arguments *)local_40,3);
        }
        instance = VarTo<Js::RecyclableObject>(pvVar7);
        pvVar7 = JavascriptOperators::GetElementIHelper
                           (instance,(Var)callInfo_local,receiver,pSVar1);
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78)
        ;
        return pvVar7;
      }
    }
  }
  else {
    hCode = -0x7ff5ebf5;
  }
  JavascriptError::ThrowTypeError(pSVar1,hCode,L"Reflect.get");
}

Assistant:

Var JavascriptReflect::EntryGet(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.get"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if  (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.get"));
        }

        if (args.Info.Count < 2 || !JavascriptOperators::IsObject(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("Reflect.get"));
        }
        Var target = args[1];
        Var propertyKey = args.Info.Count > 2 ? args[2] : undefinedValue;

        Var receiver = args.Info.Count > 3 ? args[3] : target;

        return JavascriptOperators::GetElementIHelper(VarTo<RecyclableObject>(target), propertyKey, receiver, scriptContext);
    }